

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::MarkDebugValueUsesAsDead
          (VectorDCE *this,Instruction *composite,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *dead_dbg_value)

{
  DefUseManager *this_00;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *dead_dbg_value_local;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  dead_dbg_value_local = dead_dbg_value;
  this_00 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/vector_dce.cpp:408:18)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/vector_dce.cpp:408:18)>
             ::_M_manager;
  local_38._M_unused._M_object = &dead_dbg_value_local;
  analysis::DefUseManager::ForEachUser
            (this_00,composite,(function<void_(spvtools::opt::Instruction_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void VectorDCE::MarkDebugValueUsesAsDead(
    Instruction* composite, std::vector<Instruction*>* dead_dbg_value) {
  context()->get_def_use_mgr()->ForEachUser(
      composite, [&dead_dbg_value](Instruction* use) {
        if (use->GetCommonDebugOpcode() == CommonDebugInfoDebugValue)
          dead_dbg_value->push_back(use);
      });
}